

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_ISB(DisasContext_conflict1 *s,arg_ISB *a)

{
  int iVar1;
  arg_ISB *a_local;
  DisasContext_conflict1 *s_local;
  
  iVar1 = arm_dc_feature(s,5);
  if ((iVar1 == 0) && (iVar1 = arm_dc_feature(s,9), iVar1 == 0)) {
    return false;
  }
  gen_goto_tb(s,0,(s->base).pc_next);
  return true;
}

Assistant:

static bool trans_ISB(DisasContext *s, arg_ISB *a)
{
    if (!ENABLE_ARCH_7 && !arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    /*
     * We need to break the TB after this insn to execute
     * self-modifying code correctly and also to take
     * any pending interrupts immediately.
     */
    gen_goto_tb(s, 0, s->base.pc_next);
    return true;
}